

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-window.cc
# Opt level: O2

void anon_unknown.dwarf_a07a8::TextRegBits<(anonymous_namespace)::IntArg>
               (Emulator *e,u8 v,BitArg arg,IntArg args)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  IntArg arg_00;
  
  arg_00.text = args.text;
  uVar3 = (uint)arg.mask & (uint)e;
  uVar4 = (ulong)(uVar3 == 0);
  if (arg.invert == false) {
    uVar4 = (ulong)uVar3;
  }
  pcVar1 = (&arg.true_text)[(int)uVar4 == 0];
  if (*pcVar1 != '\0') {
    ImGui::SameLine(0.0,-1.0);
    ImGui::Text("%s",pcVar1);
    pcVar1 = arg.tooltip;
    if (arg.tooltip != (char *)0x0) {
      bVar2 = ImGui::IsItemHovered(0);
      if (bVar2) {
        ImGui::SetTooltip(pcVar1);
      }
    }
  }
  arg_00.mask = (char)uVar4;
  arg_00._9_3_ = (int3)(uVar4 >> 8);
  arg_00.shift = (int)(uVar4 >> 0x20);
  TextRegBits<>((Emulator *)((ulong)e & 0xff),v,arg_00);
  return;
}

Assistant:

void TextRegBits(Emulator* e, u8 v, BitArg arg, Args... args) {
  u8 masked = v & arg.mask;
  bool is_set = arg.invert ? !masked : masked;
  const char* text = is_set ? arg.true_text : arg.false_text;
  if (strlen(text) != 0) {
    ImGui::SameLine();
    ImGui::Text("%s", text);
    if (arg.tooltip && ImGui::IsItemHovered()) {
      ImGui::SetTooltip(arg.tooltip);
    }
  }
  TextRegBits(e, v, args...);
}